

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void __thiscall
SharedObjectsTest_Test4_Test::SharedObjectsTest_Test4_Test(SharedObjectsTest_Test4_Test *this)

{
  SharedObjectsTest_Test4_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SharedObjectsTest_Test4_Test_0023e7a0;
  return;
}

Assistant:

TEST(SharedObjectsTest, Test4){
    Infector::Container ioc;
    ioc.bindSingleAs<CFooBar, IFoo, IBar>();
    ioc.bindSingleAsNothing<FooBarUser>();

    ioc.wire<CFooBar>();
    ioc.wire<FooBarUser, IFoo, IBar>();

    try{
        auto user = ioc.buildSingle<FooBarUser>();
        user->doSomething();
    }
    catch(std::exception &ex){
        std::cout<<ex.what()<<std::endl;
    }
}